

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::SymlinkCommand::getVerboseDescription
          (SymlinkCommand *this,SmallVectorImpl<char> *result)

{
  BuildNode *pBVar1;
  pointer __s;
  string *psVar2;
  void *pvVar3;
  long lVar4;
  raw_ostream *prVar5;
  char *in_RCX;
  void *extraout_RDX;
  size_type __n;
  void *extraout_RDX_00;
  void *pvVar6;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  void *__buf;
  void *__buf_00;
  char *extraout_RDX_04;
  char *pcVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  raw_svector_ostream os;
  raw_ostream local_50;
  SmallVectorImpl<char> *local_28;
  
  prVar5 = &local_50;
  local_50.BufferMode = InternalBuffer;
  local_50.OutBufStart = (char *)0x0;
  local_50.OutBufEnd = (char *)0x0;
  local_50.OutBufCur = (char *)0x0;
  local_50._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00258b50;
  local_28 = result;
  llvm::raw_ostream::SetUnbuffered(prVar5);
  Str.Length = 8;
  Str.Data = "ln -sfh ";
  llvm::raw_ostream::operator<<(prVar5,Str);
  __n = (this->linkOutputPath)._M_string_length;
  if (__n == 0) {
    pBVar1 = *(this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (pBVar1->super_Node).name._M_string_length;
    psVar2 = &(pBVar1->super_Node).name;
  }
  else {
    psVar2 = &this->linkOutputPath;
  }
  pcVar7 = (psVar2->_M_dataplus)._M_p;
  if (((this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (__n != 0)) {
    pvVar6 = extraout_RDX;
    if ((__n == 0) ||
       (pvVar3 = memchr(pcVar7,0x20,__n), pvVar6 = extraout_RDX_00, pvVar3 == (void *)0x0)) {
      lVar4 = -1;
    }
    else {
      lVar4 = (long)pvVar3 - (long)pcVar7;
    }
    if (lVar4 != -1) {
      if (local_50.OutBufCur < local_50.OutBufEnd) {
        *local_50.OutBufCur = '\"';
        local_50.OutBufCur = local_50.OutBufCur + 1;
      }
      else {
        prVar5 = (raw_ostream *)llvm::raw_ostream::write(&local_50,0x22,pvVar6,(size_t)in_RCX);
      }
      Str_01.Length = __n;
      Str_01.Data = pcVar7;
      prVar5 = llvm::raw_ostream::operator<<(prVar5,Str_01);
      in_RCX = prVar5->OutBufCur;
      if (in_RCX < prVar5->OutBufEnd) {
        pcVar7 = in_RCX + 1;
        prVar5->OutBufCur = pcVar7;
        *in_RCX = '\"';
      }
      else {
        llvm::raw_ostream::write(prVar5,0x22,__buf_00,(size_t)in_RCX);
        pcVar7 = extraout_RDX_04;
      }
      goto LAB_0015f3db;
    }
  }
  else {
    pcVar7 = "<<<missing output>>>";
    __n = 0x14;
  }
  Str_00.Length = __n;
  Str_00.Data = pcVar7;
  llvm::raw_ostream::operator<<(&local_50,Str_00);
  pcVar7 = extraout_RDX_01;
LAB_0015f3db:
  if (local_50.OutBufCur < local_50.OutBufEnd) {
    in_RCX = local_50.OutBufCur + 1;
    *local_50.OutBufCur = ' ';
    local_50.OutBufCur = in_RCX;
  }
  else {
    llvm::raw_ostream::write(&local_50,0x20,pcVar7,(size_t)in_RCX);
    pcVar7 = extraout_RDX_02;
  }
  __s = (this->contents)._M_dataplus._M_p;
  pvVar6 = (void *)(this->contents)._M_string_length;
  if ((pvVar6 == (void *)0x0) ||
     (pvVar3 = memchr(__s,0x20,(size_t)pvVar6), pcVar7 = extraout_RDX_03, pvVar3 == (void *)0x0)) {
    lVar4 = -1;
  }
  else {
    lVar4 = (long)pvVar3 - (long)__s;
  }
  if (lVar4 == -1) {
    llvm::raw_ostream::write(&local_50,(int)__s,pvVar6,(size_t)in_RCX);
  }
  else {
    if (local_50.OutBufCur < local_50.OutBufEnd) {
      in_RCX = local_50.OutBufCur + 1;
      prVar5 = &local_50;
      *local_50.OutBufCur = '\"';
      local_50.OutBufCur = in_RCX;
    }
    else {
      prVar5 = (raw_ostream *)llvm::raw_ostream::write(&local_50,0x22,pcVar7,(size_t)in_RCX);
    }
    prVar5 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar5,(int)(this->contents)._M_dataplus._M_p,
                        (void *)(this->contents)._M_string_length,(size_t)in_RCX);
    pcVar7 = prVar5->OutBufCur;
    if (pcVar7 < prVar5->OutBufEnd) {
      prVar5->OutBufCur = pcVar7 + 1;
      *pcVar7 = '\"';
    }
    else {
      llvm::raw_ostream::write(prVar5,0x22,__buf,(size_t)pcVar7);
    }
  }
  llvm::raw_ostream::~raw_ostream(&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "ln -sfh ";
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || !outputPath.empty()) {
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (outputPath.find(' ') != StringRef::npos) {
        os << '"' << outputPath << '"';
      } else {
        os << outputPath;
      }
    } else {
      os << "<<<missing output>>>";
    }
    os << ' ';
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(contents).find(' ') != StringRef::npos) {
      os << '"' << contents << '"';
    } else {
      os << contents;
    }
  }